

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O0

wchar_t populate(chunk_conflict *c,_Bool valley)

{
  ushort uVar1;
  loc_conflict to_avoid;
  int16_t iVar2;
  uint32_t uVar3;
  wchar_t local_20;
  int local_1c;
  wchar_t k;
  wchar_t j;
  wchar_t i;
  _Bool valley_local;
  chunk_conflict *c_local;
  
  local_20 = c->depth / 2;
  if (valley) {
    if (L'\x1e' < local_20) {
      local_20 = L'\x1e';
    }
  }
  else if (0x28 < c->depth) {
    local_20 = local_20 + L'\n';
  }
  uVar1 = z_info->level_monster_min;
  uVar3 = Rand_div(8);
  get_mon_num(c->depth,c->depth);
  for (local_1c = (uint)uVar1 + uVar3 + 1 + local_20 * 2; 0 < local_1c; local_1c = local_1c + -1) {
    if (local_1c < 5) {
      get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
      get_mon_num(c->depth,c->depth);
    }
    to_avoid.x = (player->grid).x;
    to_avoid.y = (player->grid).y;
    pick_and_place_distant_monster((chunk *)c,to_avoid,L'\n',true,c->depth);
  }
  uVar3 = Rand_div(local_20);
  alloc_objects(c,L'\x03',L'\x01',uVar3 + L'\x01',c->depth,'\0');
  iVar2 = Rand_normal((uint)z_info->room_item_av,3);
  alloc_objects(c,L'\x03',L'\x03',(int)iVar2,c->depth,'\x01');
  iVar2 = Rand_normal((uint)z_info->both_item_av,3);
  alloc_objects(c,L'\x03',L'\x03',(int)iVar2,c->depth,'\x01');
  iVar2 = Rand_normal((uint)z_info->both_gold_av,3);
  alloc_objects(c,L'\x03',L'\x02',(int)iVar2,c->depth,'\x01');
  return local_20;
}

Assistant:

static int populate(struct chunk *c, bool valley)
{
	int i, j;

	/* Basic "amount" */
	int k = (c->depth / 2);

	if (valley) {
		if (k > 30)
			k = 30;
	} else {
		/* Gets hairy north of the mountains */
		if (c->depth > 40)
			k += 10;
	}

	/* Pick a base number of monsters */
	i = z_info->level_monster_min + randint1(8) + k;

	/* Build the monster probability table. */
	(void) get_mon_num(c->depth, c->depth);

	/* Put some monsters in the dungeon */
	for (j = i + k; j > 0; j--) {
		/* Always have some random monsters */
		if (j < 5) {
			/* Remove all monster restrictions. */
			get_mon_num_prep(NULL);

			/* Build the monster probability table. */
			(void) get_mon_num(c->depth, c->depth);
		}

		/*
		 * Place a random monster (quickly), but not in grids marked
		 * "SQUARE_TEMP".
		 */
		(void) pick_and_place_distant_monster(c, player->grid, 10, true,
											  c->depth);
	}

	/* Place some traps in the dungeon. */
	alloc_objects(c, SET_BOTH, TYP_TRAP, randint1(k), c->depth, 0);

	/* Put some objects in rooms */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(z_info->room_item_av, 3),
				  c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(z_info->both_item_av, 3),
				 c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD, Rand_normal(z_info->both_gold_av, 3),
				 c->depth, ORIGIN_FLOOR);

	return k;
}